

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_is_valid_asn1_bitstring(CBS *cbs)

{
  int iVar1;
  byte local_2a;
  byte local_29;
  undefined1 auStack_28 [6];
  uint8_t last;
  uint8_t num_unused_bits;
  CBS in;
  CBS *cbs_local;
  
  _auStack_28 = cbs->data;
  in.data = (uint8_t *)cbs->len;
  in.len = (size_t)cbs;
  iVar1 = CBS_get_u8((CBS *)auStack_28,&local_29);
  if ((iVar1 == 0) || (7 < local_29)) {
    cbs_local._4_4_ = 0;
  }
  else if (local_29 == 0) {
    cbs_local._4_4_ = 1;
  }
  else {
    iVar1 = CBS_get_last_u8((CBS *)auStack_28,&local_2a);
    if ((iVar1 == 0) || (((uint)local_2a & (1 << (local_29 & 0x1f)) - 1U) != 0)) {
      cbs_local._4_4_ = 0;
    }
    else {
      cbs_local._4_4_ = 1;
    }
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_is_valid_asn1_bitstring(const CBS *cbs) {
  CBS in = *cbs;
  uint8_t num_unused_bits;
  if (!CBS_get_u8(&in, &num_unused_bits) || num_unused_bits > 7) {
    return 0;
  }

  if (num_unused_bits == 0) {
    return 1;
  }

  // All num_unused_bits bits must exist and be zeros.
  uint8_t last;
  if (!CBS_get_last_u8(&in, &last) ||
      (last & ((1 << num_unused_bits) - 1)) != 0) {
    return 0;
  }

  return 1;
}